

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

void rr::(anonymous_namespace)::
     flatshadeVertices<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
               (Program *program,vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *list)

{
  iterator iVar1;
  bool bVar2;
  Line *pLVar3;
  const_reference pvVar4;
  reference target;
  vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_> *local_40;
  __normal_iterator<rr::pa::Line_*,_std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>_>
  local_38;
  __normal_iterator<rr::pa::Line_*,_std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>_>
  local_30;
  iterator it;
  size_t inputNdx;
  vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_> *fragInputs;
  vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *list_local;
  Program *program_local;
  
  if (program->geometryShader == (GeometryShader *)0x0) {
    local_40 = VertexShader::getOutputs(program->vertexShader);
  }
  else {
    local_40 = GeometryShader::getOutputs(program->geometryShader);
  }
  for (it._M_current = (Line *)0x0; iVar1._M_current = it._M_current,
      pLVar3 = (Line *)std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                       size(local_40), iVar1._M_current < pLVar3;
      it._M_current = (Line *)((long)&(it._M_current)->v0 + 1)) {
    pvVar4 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::operator[]
                       (local_40,(size_type)it._M_current);
    if ((pvVar4->flatshade & 1U) != 0) {
      local_30._M_current =
           (Line *)std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::begin(list);
      while( true ) {
        local_38._M_current =
             (Line *)std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::end(list);
        bVar2 = __gnu_cxx::operator!=(&local_30,&local_38);
        if (!bVar2) break;
        target = __gnu_cxx::
                 __normal_iterator<rr::pa::Line_*,_std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>_>
                 ::operator*(&local_30);
        anon_unknown_19::flatshadePrimitiveVertices(target,(size_t)it._M_current);
        __gnu_cxx::
        __normal_iterator<rr::pa::Line_*,_std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>_>
        ::operator++(&local_30);
      }
    }
  }
  return;
}

Assistant:

void flatshadeVertices (const Program& program, ContainerType& list)
{
	// flatshade
	const std::vector<rr::VertexVaryingInfo>& fragInputs = (program.geometryShader) ? (program.geometryShader->getOutputs()) : (program.vertexShader->getOutputs());

	for (size_t inputNdx = 0; inputNdx < fragInputs.size(); ++inputNdx)
		if (fragInputs[inputNdx].flatshade)
			for (typename ContainerType::iterator it = list.begin(); it != list.end(); ++it)
				flatshadePrimitiveVertices(*it, inputNdx);
}